

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::ActualConfigure(cmake *this)

{
  cmState *pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  string *psVar6;
  string *psVar7;
  cmGlobalGenerator *pcVar8;
  ulong uVar9;
  pointer this_01;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *this_02;
  const_reference ppcVar10;
  allocator<char> local_4d9;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  cmMakefile *local_490;
  cmMakefile *mf;
  string local_480;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  cmake *local_3c0;
  unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_> local_3b8;
  allocator<char> local_3a9;
  string local_3a8;
  allocator<char> local_381;
  undefined1 local_380 [8];
  string message_3;
  string local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_338;
  string *tsName;
  string local_328;
  allocator<char> local_301;
  undefined1 local_300 [8];
  string message_2;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b8;
  string *platformName;
  string local_2a8;
  allocator<char> local_281;
  undefined1 local_280 [8];
  string message_1;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  string *instance;
  allocator<char> local_209;
  string local_208;
  string local_1e8 [39];
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  string local_178 [39];
  allocator<char> local_151;
  undefined1 local_150 [8];
  string message;
  string local_128;
  string *local_108;
  string *genName;
  string local_f8;
  undefined1 local_d8 [8];
  string fullName;
  string local_b0;
  string *local_90;
  string *extraGenName;
  string local_80;
  string *local_60;
  string *genName_1;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  cmake *pcStack_18;
  int res;
  cmake *this_local;
  
  pcStack_18 = this;
  UpdateConversionPathTable(this);
  CleanupCommandsAndMacros(this);
  local_1c = DoPreConfigureChecks(this);
  if (local_1c < 0) {
    this_local._4_4_ = -2;
  }
  else {
    if (local_1c == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"CMAKE_HOME_DIRECTORY",&local_41);
      GetHomeDirectory_abi_cxx11_(this);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      AddCacheEntry(this,&local_40,pcVar5,
                    "Source directory with the top level CMakeLists.txt file for this project",4);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
    }
    if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
      pcVar1 = this->State;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"CMAKE_GENERATOR",(allocator<char> *)((long)&extraGenName + 7))
      ;
      psVar6 = cmState::GetInitializedCacheValue(pcVar1,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)((long)&extraGenName + 7));
      pcVar1 = this->State;
      local_60 = psVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"CMAKE_EXTRA_GENERATOR",
                 (allocator<char> *)(fullName.field_2._M_local_buf + 0xf));
      psVar7 = cmState::GetInitializedCacheValue(pcVar1,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)(fullName.field_2._M_local_buf + 0xf));
      psVar6 = local_60;
      local_90 = psVar7;
      if (local_60 != (string *)0x0) {
        genName._6_1_ = 0;
        if (psVar7 == (string *)0x0) {
          std::allocator<char>::allocator();
          genName._6_1_ = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f8,"",(allocator<char> *)((long)&genName + 7));
        }
        else {
          std::__cxx11::string::string((string *)&local_f8,(string *)psVar7);
        }
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                  ((string *)local_d8,psVar6,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        if ((genName._6_1_ & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)((long)&genName + 7));
        }
        pcVar8 = CreateGlobalGenerator(this,(string *)local_d8);
        this->GlobalGenerator = pcVar8;
        std::__cxx11::string::~string((string *)local_d8);
      }
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
        CreateDefaultGlobalGenerator(this);
      }
      else {
        bVar2 = cmGlobalGenerator::GetForceUnixPaths(this->GlobalGenerator);
        cmSystemTools::SetForceUnixPaths(bVar2);
      }
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
        cmSystemTools::Error("Could not create generator",(char *)0x0,(char *)0x0,(char *)0x0);
        return -1;
      }
    }
    pcVar1 = this->State;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"CMAKE_GENERATOR",
               (allocator<char> *)(message.field_2._M_local_buf + 0xf));
    psVar6 = cmState::GetInitializedCacheValue(pcVar1,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)(message.field_2._M_local_buf + 0xf));
    local_108 = psVar6;
    if ((psVar6 == (string *)0x0) ||
       (uVar4 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[4])(this->GlobalGenerator,psVar6),
       (uVar4 & 1) != 0)) {
      pcVar1 = this->State;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_198,"CMAKE_GENERATOR",&local_199);
      psVar6 = cmState::GetInitializedCacheValue(pcVar1,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator(&local_199);
      if (psVar6 == (string *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c0,"CMAKE_GENERATOR",&local_1c1);
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_1e8);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        AddCacheEntry(this,&local_1c0,pcVar5,"Name of generator.",4);
        std::__cxx11::string::~string(local_1e8);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator(&local_1c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,"CMAKE_EXTRA_GENERATOR",&local_209);
        cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_
                  ((string *)&instance,this->GlobalGenerator);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        AddCacheEntry(this,&local_208,pcVar5,"Name of external makefile project generator.",4);
        std::__cxx11::string::~string((string *)&instance);
        std::__cxx11::string::~string((string *)&local_208);
        std::allocator<char>::~allocator(&local_209);
      }
      pcVar1 = this->State;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,"CMAKE_GENERATOR_INSTANCE",
                 (allocator<char> *)(message_1.field_2._M_local_buf + 0xf));
      psVar6 = cmState::GetInitializedCacheValue(pcVar1,&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator((allocator<char> *)(message_1.field_2._M_local_buf + 0xf));
      local_238 = psVar6;
      if (psVar6 == (string *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,"CMAKE_GENERATOR_INSTANCE",
                   (allocator<char> *)((long)&platformName + 7));
        pcVar5 = (char *)std::__cxx11::string::c_str();
        AddCacheEntry(this,&local_2a8,pcVar5,"Generator instance identifier.",4);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&platformName + 7));
      }
      else {
        uVar9 = std::__cxx11::string::empty();
        if (((uVar9 & 1) == 0) &&
           (bVar2 = std::operator!=(&this->GeneratorInstance,local_238), bVar2)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_280,"Error: generator instance: ",&local_281);
          std::allocator<char>::~allocator(&local_281);
          std::__cxx11::string::operator+=((string *)local_280,(string *)&this->GeneratorInstance);
          std::__cxx11::string::operator+=
                    ((string *)local_280,"\nDoes not match the instance used previously: ");
          std::__cxx11::string::operator+=((string *)local_280,(string *)local_238);
          std::__cxx11::string::operator+=
                    ((string *)local_280,
                     "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                    );
          cmSystemTools::Error((string *)local_280);
          this_local._4_4_ = -2;
          std::__cxx11::string::~string((string *)local_280);
          return this_local._4_4_;
        }
      }
      pcVar1 = this->State;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d8,"CMAKE_GENERATOR_PLATFORM",
                 (allocator<char> *)(message_2.field_2._M_local_buf + 0xf));
      psVar6 = cmState::GetInitializedCacheValue(pcVar1,&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::allocator<char>::~allocator((allocator<char> *)(message_2.field_2._M_local_buf + 0xf));
      local_2b8 = psVar6;
      if (psVar6 == (string *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_328,"CMAKE_GENERATOR_PLATFORM",
                   (allocator<char> *)((long)&tsName + 7));
        pcVar5 = (char *)std::__cxx11::string::c_str();
        AddCacheEntry(this,&local_328,pcVar5,"Name of generator platform.",4);
        std::__cxx11::string::~string((string *)&local_328);
        std::allocator<char>::~allocator((allocator<char> *)((long)&tsName + 7));
      }
      else {
        uVar9 = std::__cxx11::string::empty();
        if (((uVar9 & 1) == 0) &&
           (bVar2 = std::operator!=(&this->GeneratorPlatform,local_2b8), bVar2)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_300,"Error: generator platform: ",&local_301);
          std::allocator<char>::~allocator(&local_301);
          std::__cxx11::string::operator+=((string *)local_300,(string *)&this->GeneratorPlatform);
          std::__cxx11::string::operator+=
                    ((string *)local_300,"\nDoes not match the platform used previously: ");
          std::__cxx11::string::operator+=((string *)local_300,(string *)local_2b8);
          std::__cxx11::string::operator+=
                    ((string *)local_300,
                     "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                    );
          cmSystemTools::Error((string *)local_300);
          this_local._4_4_ = -2;
          std::__cxx11::string::~string((string *)local_300);
          return this_local._4_4_;
        }
      }
      pcVar1 = this->State;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_358,"CMAKE_GENERATOR_TOOLSET",
                 (allocator<char> *)(message_3.field_2._M_local_buf + 0xf));
      psVar6 = cmState::GetInitializedCacheValue(pcVar1,&local_358);
      std::__cxx11::string::~string((string *)&local_358);
      std::allocator<char>::~allocator((allocator<char> *)(message_3.field_2._M_local_buf + 0xf));
      local_338 = psVar6;
      if (psVar6 == (string *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a8,"CMAKE_GENERATOR_TOOLSET",&local_3a9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        AddCacheEntry(this,&local_3a8,pcVar5,"Name of generator toolset.",4);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::allocator<char>::~allocator(&local_3a9);
      }
      else {
        uVar9 = std::__cxx11::string::empty();
        if (((uVar9 & 1) == 0) &&
           (bVar2 = std::operator!=(&this->GeneratorToolset,local_338), bVar2)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_380,"Error: generator toolset: ",&local_381);
          std::allocator<char>::~allocator(&local_381);
          std::__cxx11::string::operator+=((string *)local_380,(string *)&this->GeneratorToolset);
          std::__cxx11::string::operator+=
                    ((string *)local_380,"\nDoes not match the toolset used previously: ");
          std::__cxx11::string::operator+=((string *)local_380,(string *)local_338);
          std::__cxx11::string::operator+=
                    ((string *)local_380,
                     "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                    );
          cmSystemTools::Error((string *)local_380);
          this_local._4_4_ = -2;
          std::__cxx11::string::~string((string *)local_380);
          return this_local._4_4_;
        }
      }
      bVar2 = cmState::GetIsInTryCompile(this->State);
      if (!bVar2) {
        cmGlobalGenerator::ClearEnabledLanguages(this->GlobalGenerator);
        TruncateOutputLog(this,"CMakeOutput.log");
        TruncateOutputLog(this,"CMakeError.log");
      }
      local_3c0 = this;
      std::make_unique<cmFileAPI,cmake*>((cmake **)&local_3b8);
      std::unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_>::operator=
                (&this->FileAPI,&local_3b8);
      std::unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_>::~unique_ptr(&local_3b8);
      this_01 = std::unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_>::operator->
                          (&this->FileAPI);
      cmFileAPI::ReadQueries(this_01);
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0xb])();
      pcVar1 = this->State;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e0,"CMAKE_BACKWARDS_COMPATIBILITY",&local_3e1);
      psVar6 = cmState::GetInitializedCacheValue(pcVar1,&local_3e0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::allocator<char>::~allocator(&local_3e1);
      if (psVar6 != (string *)0x0) {
        pcVar1 = this->State;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_408,"LIBRARY_OUTPUT_PATH",&local_409);
        psVar6 = cmState::GetInitializedCacheValue(pcVar1,&local_408);
        std::__cxx11::string::~string((string *)&local_408);
        std::allocator<char>::~allocator(&local_409);
        if (psVar6 == (string *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_430,"LIBRARY_OUTPUT_PATH",&local_431);
          AddCacheEntry(this,&local_430,"","Single output directory for building all libraries.",1);
          std::__cxx11::string::~string((string *)&local_430);
          std::allocator<char>::~allocator(&local_431);
        }
        pcVar1 = this->State;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_458,"EXECUTABLE_OUTPUT_PATH",&local_459);
        psVar6 = cmState::GetInitializedCacheValue(pcVar1,&local_458);
        std::__cxx11::string::~string((string *)&local_458);
        std::allocator<char>::~allocator(&local_459);
        if (psVar6 == (string *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_480,"EXECUTABLE_OUTPUT_PATH",
                     (allocator<char> *)((long)&mf + 7));
          AddCacheEntry(this,&local_480,"","Single output directory for building all executables.",1
                       );
          std::__cxx11::string::~string((string *)&local_480);
          std::allocator<char>::~allocator((allocator<char> *)((long)&mf + 7));
        }
      }
      this_02 = cmGlobalGenerator::GetMakefiles(this->GlobalGenerator);
      ppcVar10 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[](this_02,0);
      this_00 = *ppcVar10;
      local_490 = this_00;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b0,"CTEST_USE_LAUNCHERS",&local_4b1);
      bVar3 = cmMakefile::IsOn(this_00,&local_4b0);
      bVar2 = false;
      if (bVar3) {
        pcVar1 = this->State;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4d8,"RULE_LAUNCH_COMPILE",&local_4d9);
        pcVar5 = cmState::GetGlobalProperty(pcVar1,&local_4d8);
        bVar2 = pcVar5 == (char *)0x0;
        std::__cxx11::string::~string((string *)&local_4d8);
        std::allocator<char>::~allocator(&local_4d9);
      }
      std::__cxx11::string::~string((string *)&local_4b0);
      std::allocator<char>::~allocator(&local_4b1);
      if (bVar2) {
        cmSystemTools::Error
                  ("CTEST_USE_LAUNCHERS is enabled, but the RULE_LAUNCH_COMPILE global property is not defined.\nDid you forget to include(CTest) in the toplevel CMakeLists.txt ?"
                   ,(char *)0x0,(char *)0x0,(char *)0x0);
      }
      pcVar1 = this->State;
      psVar6 = GetHomeOutputDirectory_abi_cxx11_(this);
      cmState::SaveVerificationScript(pcVar1,psVar6);
      psVar6 = GetHomeOutputDirectory_abi_cxx11_(this);
      SaveCache(this,psVar6);
      bVar2 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar2) {
        this_local._4_4_ = -1;
      }
      else {
        this_local._4_4_ = 0;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_150,"Error: generator : ",&local_151);
      std::allocator<char>::~allocator(&local_151);
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_178);
      std::__cxx11::string::operator+=((string *)local_150,local_178);
      std::__cxx11::string::~string(local_178);
      std::__cxx11::string::operator+=
                ((string *)local_150,"\nDoes not match the generator used previously: ");
      std::__cxx11::string::operator+=((string *)local_150,(string *)local_108);
      std::__cxx11::string::operator+=
                ((string *)local_150,
                 "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                );
      cmSystemTools::Error((string *)local_150);
      this_local._4_4_ = -2;
      std::__cxx11::string::~string((string *)local_150);
    }
  }
  return this_local._4_4_;
}

Assistant:

int cmake::ActualConfigure()
{
  // Construct right now our path conversion table before it's too late:
  this->UpdateConversionPathTable();
  this->CleanupCommandsAndMacros();

  int res = this->DoPreConfigureChecks();
  if (res < 0) {
    return -2;
  }
  if (!res) {
    this->AddCacheEntry(
      "CMAKE_HOME_DIRECTORY", this->GetHomeDirectory().c_str(),
      "Source directory with the top level CMakeLists.txt file for this "
      "project",
      cmStateEnums::INTERNAL);
  }

  // no generator specified on the command line
  if (!this->GlobalGenerator) {
    const std::string* genName =
      this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
    const std::string* extraGenName =
      this->State->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
    if (genName) {
      std::string fullName =
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
          *genName, extraGenName ? *extraGenName : "");
      this->GlobalGenerator = this->CreateGlobalGenerator(fullName);
    }
    if (this->GlobalGenerator) {
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths(
        this->GlobalGenerator->GetForceUnixPaths());
    } else {
      this->CreateDefaultGlobalGenerator();
    }
    if (!this->GlobalGenerator) {
      cmSystemTools::Error("Could not create generator");
      return -1;
    }
  }

  const std::string* genName =
    this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
  if (genName) {
    if (!this->GlobalGenerator->MatchesGeneratorName(*genName)) {
      std::string message = "Error: generator : ";
      message += this->GlobalGenerator->GetName();
      message += "\nDoes not match the generator used previously: ";
      message += *genName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message);
      return -2;
    }
  }
  if (!this->State->GetInitializedCacheValue("CMAKE_GENERATOR")) {
    this->AddCacheEntry("CMAKE_GENERATOR",
                        this->GlobalGenerator->GetName().c_str(),
                        "Name of generator.", cmStateEnums::INTERNAL);
    this->AddCacheEntry("CMAKE_EXTRA_GENERATOR",
                        this->GlobalGenerator->GetExtraGeneratorName().c_str(),
                        "Name of external makefile project generator.",
                        cmStateEnums::INTERNAL);
  }

  if (const std::string* instance =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_INSTANCE")) {
    if (!this->GeneratorInstance.empty() &&
        this->GeneratorInstance != *instance) {
      std::string message = "Error: generator instance: ";
      message += this->GeneratorInstance;
      message += "\nDoes not match the instance used previously: ";
      message += *instance;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry(
      "CMAKE_GENERATOR_INSTANCE", this->GeneratorInstance.c_str(),
      "Generator instance identifier.", cmStateEnums::INTERNAL);
  }

  if (const std::string* platformName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_PLATFORM")) {
    if (!this->GeneratorPlatform.empty() &&
        this->GeneratorPlatform != *platformName) {
      std::string message = "Error: generator platform: ";
      message += this->GeneratorPlatform;
      message += "\nDoes not match the platform used previously: ";
      message += *platformName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_PLATFORM",
                        this->GeneratorPlatform.c_str(),
                        "Name of generator platform.", cmStateEnums::INTERNAL);
  }

  if (const std::string* tsName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_TOOLSET")) {
    if (!this->GeneratorToolset.empty() && this->GeneratorToolset != *tsName) {
      std::string message = "Error: generator toolset: ";
      message += this->GeneratorToolset;
      message += "\nDoes not match the toolset used previously: ";
      message += *tsName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_TOOLSET",
                        this->GeneratorToolset.c_str(),
                        "Name of generator toolset.", cmStateEnums::INTERNAL);
  }

  // reset any system configuration information, except for when we are
  // InTryCompile. With TryCompile the system info is taken from the parent's
  // info to save time
  if (!this->State->GetIsInTryCompile()) {
    this->GlobalGenerator->ClearEnabledLanguages();

    this->TruncateOutputLog("CMakeOutput.log");
    this->TruncateOutputLog("CMakeError.log");
  }

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->FileAPI = cm::make_unique<cmFileAPI>(this);
  this->FileAPI->ReadQueries();
#endif

  // actually do the configure
  this->GlobalGenerator->Configure();
  // Before saving the cache
  // if the project did not define one of the entries below, add them now
  // so users can edit the values in the cache:

  // We used to always present LIBRARY_OUTPUT_PATH and
  // EXECUTABLE_OUTPUT_PATH.  They are now documented as old-style and
  // should no longer be used.  Therefore we present them only if the
  // project requires compatibility with CMake 2.4.  We detect this
  // here by looking for the old CMAKE_BACKWARDS_COMPATIBILITY
  // variable created when CMP0001 is not set to NEW.
  if (this->State->GetInitializedCacheValue("CMAKE_BACKWARDS_COMPATIBILITY")) {
    if (!this->State->GetInitializedCacheValue("LIBRARY_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "LIBRARY_OUTPUT_PATH", "",
        "Single output directory for building all libraries.",
        cmStateEnums::PATH);
    }
    if (!this->State->GetInitializedCacheValue("EXECUTABLE_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "EXECUTABLE_OUTPUT_PATH", "",
        "Single output directory for building all executables.",
        cmStateEnums::PATH);
    }
  }

  cmMakefile* mf = this->GlobalGenerator->GetMakefiles()[0];
  if (mf->IsOn("CTEST_USE_LAUNCHERS") &&
      !this->State->GetGlobalProperty("RULE_LAUNCH_COMPILE")) {
    cmSystemTools::Error(
      "CTEST_USE_LAUNCHERS is enabled, but the "
      "RULE_LAUNCH_COMPILE global property is not defined.\n"
      "Did you forget to include(CTest) in the toplevel "
      "CMakeLists.txt ?");
  }

  this->State->SaveVerificationScript(this->GetHomeOutputDirectory());
  this->SaveCache(this->GetHomeOutputDirectory());
  if (cmSystemTools::GetErrorOccuredFlag()) {
    return -1;
  }
  return 0;
}